

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2,
               char *args_3,unsigned_long args_4,char *args_5,unsigned_long args_6)

{
  stringstream *in_RCX;
  char *in_RSI;
  unsigned_long in_RDI;
  unsigned_long *in_R8;
  char *in_R9;
  unsigned_long in_stack_00000010;
  unsigned_long in_stack_ffffffffffffffc8;
  
  std::operator<<((ostream *)(in_RDI + 0x10),*(char **)in_RSI);
  str_cat_impl<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,args_3,in_stack_00000010,in_RSI,in_RDI);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}